

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrule.cpp
# Opt level: O1

bool __thiscall QMimeMagicRule::operator==(QMimeMagicRule *this,QMimeMagicRule *other)

{
  bool bVar1;
  
  if (this->m_type != other->m_type) {
    return false;
  }
  bVar1 = ::operator==(&this->m_value,&other->m_value);
  if ((((bVar1) && (this->m_startPos == other->m_startPos)) && (this->m_endPos == other->m_endPos))
     && (((bVar1 = ::operator==(&this->m_mask,&other->m_mask), bVar1 &&
          (bVar1 = ::operator==(&this->m_pattern,&other->m_pattern), bVar1)) &&
         ((this->m_number == other->m_number && (this->m_numberMask == other->m_numberMask)))))) {
    return (*(long *)&this->field_0x80 == *(long *)&other->field_0x80 || this->m_matchFunction == 0)
           && this->m_matchFunction == other->m_matchFunction;
  }
  return false;
}

Assistant:

bool QMimeMagicRule::operator==(const QMimeMagicRule &other) const
{
    return m_type == other.m_type &&
           m_value == other.m_value &&
           m_startPos == other.m_startPos &&
           m_endPos == other.m_endPos &&
           m_mask == other.m_mask &&
           m_pattern == other.m_pattern &&
           m_number == other.m_number &&
           m_numberMask == other.m_numberMask &&
           m_matchFunction == other.m_matchFunction;
}